

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::color3d>::get
          (Animatable<tinyusdz::value::color3d> *this,double t,color3d *v,
          TimeSampleInterpolationType tinerp)

{
  double dVar1;
  bool bVar2;
  
  if ((v == (color3d *)0x0) || (this->_blocked != false)) {
LAB_003f497e:
    bVar2 = false;
  }
  else {
    if ((!NAN(t)) || (this->_has_value != true)) {
      bVar2 = has_timesamples(this);
      if (bVar2) {
        bVar2 = TypedTimeSamples<tinyusdz::value::color3d>::get<tinyusdz::value::color3d,_nullptr>
                          (&this->_ts,v,t,tinerp);
        return bVar2;
      }
      if ((this->_has_value != true) || (this->_blocked != false)) goto LAB_003f497e;
    }
    v->b = (this->_value).b;
    dVar1 = (this->_value).g;
    v->r = (this->_value).r;
    v->g = dVar1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }